

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O1

void printKTXHeader(KTX_header *pHeader)

{
  fwrite("identifier: ",0xc,1,_stdout);
  printIdentifier(pHeader->identifier,false);
  fputc(10,_stdout);
  fprintf(_stdout,"endianness: %#x\n",(ulong)pHeader->endianness);
  fprintf(_stdout,"glType: %#x\n",(ulong)pHeader->glType);
  fprintf(_stdout,"glTypeSize: %u\n",(ulong)pHeader->glTypeSize);
  fprintf(_stdout,"glFormat: %#x\n",(ulong)pHeader->glFormat);
  fprintf(_stdout,"glInternalformat: %#x\n",(ulong)pHeader->glInternalformat);
  fprintf(_stdout,"glBaseInternalformat: %#x\n",(ulong)pHeader->glBaseInternalformat);
  fprintf(_stdout,"pixelWidth: %u\n",(ulong)pHeader->pixelWidth);
  fprintf(_stdout,"pixelHeight: %u\n",(ulong)pHeader->pixelHeight);
  fprintf(_stdout,"pixelDepth: %u\n",(ulong)pHeader->pixelDepth);
  fprintf(_stdout,"numberOfArrayElements: %u\n",(ulong)pHeader->numberOfArrayElements);
  fprintf(_stdout,"numberOfFaces: %u\n",(ulong)pHeader->numberOfFaces);
  fprintf(_stdout,"numberOfMipLevels: %u\n",(ulong)pHeader->numberOfMipLevels);
  fprintf(_stdout,"bytesOfKeyValueData: %u\n",(ulong)pHeader->bytesOfKeyValueData);
  return;
}

Assistant:

void
printKTXHeader(KTX_header* pHeader)
{
    fprintf(stdout, "identifier: ");
    printIdentifier(pHeader->identifier, false);
    fprintf(stdout, "\n");
    fprintf(stdout, "endianness: %#x\n", pHeader->endianness);
    fprintf(stdout, "glType: %#x\n", pHeader->glType);
    fprintf(stdout, "glTypeSize: %u\n", pHeader->glTypeSize);
    fprintf(stdout, "glFormat: %#x\n", pHeader->glFormat);
    fprintf(stdout, "glInternalformat: %#x\n", pHeader->glInternalformat);
    fprintf(stdout, "glBaseInternalformat: %#x\n",
            pHeader->glBaseInternalformat);
    fprintf(stdout, "pixelWidth: %u\n", pHeader->pixelWidth);
    fprintf(stdout, "pixelHeight: %u\n", pHeader->pixelHeight);
    fprintf(stdout, "pixelDepth: %u\n", pHeader->pixelDepth);
    fprintf(stdout, "numberOfArrayElements: %u\n",
            pHeader->numberOfArrayElements);
    fprintf(stdout, "numberOfFaces: %u\n", pHeader->numberOfFaces);
    fprintf(stdout, "numberOfMipLevels: %u\n", pHeader->numberOfMipLevels);
    fprintf(stdout, "bytesOfKeyValueData: %u\n", pHeader->bytesOfKeyValueData);
}